

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

try_update_result_type __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::try_insert(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *this,art_key_type k,value_type v,olc_db_leaf_unique_ptr_type *cached_leaf)

{
  tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_00;
  optimistic_lock *poVar1;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *this_01;
  value_view v_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_key;
  value_view v_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_01;
  value_view v_02;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_02;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *this_02;
  __atomic_base<unsigned_long> this_03;
  undefined1 auVar2 [8];
  bool bVar3;
  node_type type;
  int iVar4;
  pointer ptr;
  atomic<long> *paVar5;
  pointer poVar6;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> **ppiVar7;
  version_type other;
  basic_node_ptr<unodb::detail::olc_node_header> bVar8;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar9;
  basic_node_ptr<unodb::detail::olc_node_header> child;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *child_in_parent;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  local_458;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  add_result;
  basic_node_ptr<unodb::detail::olc_node_header> local_440;
  undefined4 local_434;
  EVP_PKEY_CTX *local_430;
  write_guard local_428;
  write_guard node_guard_1;
  write_guard parent_guard_1;
  db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node_1;
  uint local_3d8;
  byte local_3d1;
  uint shared_prefix_length;
  key_prefix_size key_prefix_length;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
  *key_prefix;
  olc_inode<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *inode;
  basic_node_ptr<unodb::detail::olc_node_header> local_3b8;
  undefined4 local_3ac;
  version_tag_type local_3a8;
  pointer local_3a0;
  EVP_PKEY_CTX *local_398;
  pointer local_390;
  write_guard local_388;
  write_guard node_guard;
  write_guard parent_guard;
  db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  new_node;
  bool local_341;
  pointer local_340;
  pointer local_338;
  undefined1 local_330 [8];
  key_view existing_key;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *leaf;
  undefined1 auStack_310 [7];
  node_type node_type;
  read_critical_section node_critical_section;
  art_key_type remaining_key;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piStack_2e8;
  tree_depth_type depth;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  basic_node_ptr<unodb::detail::olc_node_header> local_2d8;
  write_guard local_2d0;
  write_guard write_unlock_on_exit;
  basic_node_ptr<unodb::detail::olc_node_header> local_290;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  undefined1 local_280 [8];
  read_critical_section parent_critical_section;
  olc_db_leaf_unique_ptr_type *cached_leaf_local;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  value_type v_local;
  art_key_type k_local;
  bool result_6;
  bool result_3;
  bool result;
  bool result_1;
  bool result_4;
  bool result_7;
  bool result_8;
  version_type local_150;
  version_tag_type local_148;
  byte local_139;
  optimistic_lock *poStack_138;
  bool result_5;
  version_type local_130;
  version_tag_type local_128;
  byte local_119;
  optimistic_lock *poStack_118;
  bool result_2;
  version_type local_110;
  long local_108;
  __int_type_conflict old_value_2;
  long local_f8;
  __int_type_conflict old_value_1;
  long local_e8;
  __int_type_conflict old_value;
  long local_d8;
  memory_order local_d0;
  int local_cc;
  memory_order __b;
  long local_c0;
  memory_order local_b8;
  int local_b4;
  memory_order __b_1;
  long local_a8;
  memory_order local_a0;
  int local_9c;
  memory_order __b_2;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  long local_80;
  undefined8 local_78;
  undefined4 local_6c;
  undefined8 local_68;
  atomic<long> *local_60;
  long local_58;
  undefined8 local_50;
  undefined4 local_44;
  undefined8 local_40;
  atomic<long> *local_38;
  long local_30;
  undefined8 local_28;
  undefined4 local_1c;
  undefined8 local_18;
  atomic<long> *local_10;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  this_local = (olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                *)v._M_ptr;
  k_local.field_0.key._M_ptr = (pointer)k.field_0._8_8_;
  v_local._M_extent._M_extent_value = k.field_0._0_8_;
  parent_critical_section.version.version = (version_tag_type)cached_leaf;
  optimistic_lock::try_read_lock((optimistic_lock *)local_280);
  bVar3 = optimistic_lock::read_critical_section::must_restart((read_critical_section *)local_280);
  if (bVar3) {
    spin_wait_loop_body();
    std::optional<bool>::optional
              ((optional<bool> *)((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
    node.tagged_ptr._4_4_ = 1;
  }
  else {
    local_290 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                ::load(&this->root);
    bVar3 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                      (&local_290,(nullptr_t)0x0);
    if (bVar3) {
      k_02.field_0.key._M_extent._M_extent_value =
           (__extent_storage<18446744073709551615UL>)
           (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
      k_02.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
      v_02._M_extent._M_extent_value = (size_t)v_local._M_ptr;
      v_02._M_ptr = (pointer)this_local;
      detail::
      create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>_conflict
                  *)parent_critical_section.version.version,k_02,v_02,this);
      optimistic_lock::write_guard::write_guard(&local_2d0,(read_critical_section *)local_280);
      bVar3 = optimistic_lock::write_guard::must_restart(&local_2d0);
      if (bVar3) {
        std::optional<bool>::optional
                  ((optional<bool> *)((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
      }
      else {
        ptr = std::
              unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::release((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                         *)parent_critical_section.version.version);
        detail::basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                  (&local_2d8,&ptr->super_olc_node_header,LEAF);
        in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::
        operator=(&this->root,local_2d8);
        node_in_parent._7_1_ = 1;
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)((long)&k_local.field_0.key._M_extent._M_extent_value + 6),
                   (bool *)((long)&node_in_parent + 7));
      }
      node.tagged_ptr._4_4_ = 1;
      optimistic_lock::write_guard::~write_guard(&local_2d0);
    }
    else {
      piStack_2e8 = &this->root;
      detail::
      tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
      ::tree_depth((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4),0);
      node_critical_section.version.version = v_local._M_extent._M_extent_value;
      remaining_key.field_0.key._M_ptr = k_local.field_0.key._M_ptr;
      bVar3 = optimistic_lock::read_critical_section::check((read_critical_section *)local_280);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        do {
          detail::node_ptr_lock(&local_290);
          optimistic_lock::try_read_lock((optimistic_lock *)auStack_310);
          bVar3 = optimistic_lock::read_critical_section::must_restart
                            ((read_critical_section *)auStack_310);
          if (bVar3) {
            std::optional<bool>::optional
                      ((optional<bool> *)((long)&k_local.field_0.key._M_extent._M_extent_value + 6))
            ;
            node.tagged_ptr._4_4_ = 1;
          }
          else {
            type = detail::basic_node_ptr<unodb::detail::olc_node_header>::type(&local_290);
            if (type == LEAF) {
              existing_key._M_extent._M_extent_value =
                   (size_t)detail::basic_node_ptr<unodb::detail::olc_node_header>::
                           ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>*>
                                     (&local_290);
              _local_330 = detail::
                           basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                           ::get_key_view((basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                                           *)existing_key._M_extent._M_extent_value);
              local_340 = (pointer)local_330;
              local_338 = existing_key._M_ptr;
              iVar4 = detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                      cmp((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                          &v_local._M_extent,(void *)local_330,existing_key._M_ptr);
              auVar2 = local_280;
              if (iVar4 == 0) {
                poVar1 = (optimistic_lock *)local_280;
                paVar5 = (atomic<long> *)((long)local_280 + 8);
                local_cc = 2;
                poStack_118 = poVar1;
                ___b = paVar5;
                local_d0 = std::operator&(acquire,__memory_order_mask);
                if (local_cc - 1U < 2) {
                  local_d8 = (paVar5->super___atomic_base<long>)._M_i;
                }
                else if (local_cc == 5) {
                  local_d8 = (paVar5->super___atomic_base<long>)._M_i;
                }
                else {
                  local_d8 = (paVar5->super___atomic_base<long>)._M_i;
                }
                if (local_d8 < 1) {
                  __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                }
                local_8c = 2;
                local_128 = (version_tag_type)
                            optimistic_lock::atomic_version_type::load_relaxed
                                      ((atomic_version_type *)auVar2);
                local_119 = optimistic_lock::version_type::operator==
                                      (&local_110,(version_type)local_128);
                if (((local_119 ^ 0xff) & 1) != 0) {
                  optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar2);
                }
                this_03._M_i = _auStack_310;
                if ((local_119 & 1) != 0) {
                  local_60 = (atomic<long> *)((long)auVar2 + 8);
                  local_68 = 1;
                  local_6c = 3;
                  local_78 = 1;
                  LOCK();
                  local_e8 = (local_60->super___atomic_base<long>)._M_i;
                  (local_60->super___atomic_base<long>)._M_i =
                       (local_60->super___atomic_base<long>)._M_i + -1;
                  UNLOCK();
                  old_value = (__int_type_conflict)poVar1;
                  local_80 = local_e8;
                  if (local_e8 < 1) {
                    __assert_fail("old_value > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const")
                    ;
                  }
                }
                local_280 = (undefined1  [8])0x0;
                if (((local_119 & 1 ^ 0xff) & 1) == 0) {
                  poVar1 = (optimistic_lock *)_auStack_310;
                  paVar5 = (atomic<long> *)(_auStack_310 + 8);
                  local_b4 = 2;
                  poStack_138 = poVar1;
                  ___b_1 = paVar5;
                  local_b8 = std::operator&(acquire,__memory_order_mask);
                  if (local_b4 - 1U < 2) {
                    local_c0 = (paVar5->super___atomic_base<long>)._M_i;
                  }
                  else if (local_b4 == 5) {
                    local_c0 = (paVar5->super___atomic_base<long>)._M_i;
                  }
                  else {
                    local_c0 = (paVar5->super___atomic_base<long>)._M_i;
                  }
                  if (local_c0 < 1) {
                    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
                  }
                  local_88 = 2;
                  local_148 = (version_tag_type)
                              optimistic_lock::atomic_version_type::load_relaxed
                                        ((atomic_version_type *)this_03._M_i);
                  local_139 = optimistic_lock::version_type::operator==
                                        (&local_130,(version_type)local_148);
                  if (((local_139 ^ 0xff) & 1) != 0) {
                    optimistic_lock::dec_read_lock_count((optimistic_lock *)this_03._M_i);
                  }
                  if ((local_139 & 1) != 0) {
                    local_38 = (atomic<long> *)(this_03._M_i + 8);
                    local_40 = 1;
                    local_44 = 3;
                    local_50 = 1;
                    LOCK();
                    local_f8 = (local_38->super___atomic_base<long>)._M_i;
                    (local_38->super___atomic_base<long>)._M_i =
                         (local_38->super___atomic_base<long>)._M_i + -1;
                    UNLOCK();
                    old_value_1 = (__int_type_conflict)poVar1;
                    local_58 = local_f8;
                    if (local_f8 < 1) {
                      __assert_fail("old_value > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x343,
                                    "void unodb::optimistic_lock::dec_read_lock_count() const");
                    }
                  }
                  _auStack_310 = 0;
                  if (((local_139 & 1 ^ 0xff) & 1) == 0) {
                    bVar3 = std::operator==((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                             *)parent_critical_section.version.version,
                                            (nullptr_t)0x0);
                    if (((bVar3 ^ 0xffU) & 1) != 0) {
                      std::
                      unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      ::reset((unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)parent_critical_section.version.version,(pointer)0x0);
                    }
                    local_341 = false;
                    std::optional<bool>::optional<bool,_true>
                              ((optional<bool> *)
                               ((long)&k_local.field_0.key._M_extent._M_extent_value + 6),&local_341
                              );
                    node.tagged_ptr._4_4_ = 1;
                  }
                  else {
                    std::optional<bool>::optional
                              ((optional<bool> *)
                               ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                    node.tagged_ptr._4_4_ = 1;
                  }
                }
                else {
                  std::optional<bool>::optional
                            ((optional<bool> *)
                             ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                  node.tagged_ptr._4_4_ = 1;
                }
              }
              else {
                k_01.field_0.key._M_extent._M_extent_value =
                     (__extent_storage<18446744073709551615UL>)
                     (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
                k_01.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
                v_01._M_extent._M_extent_value = (size_t)v_local._M_ptr;
                v_01._M_ptr = (pointer)this_local;
                detail::
                create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                          ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>_conflict
                            *)parent_critical_section.version.version,k_01,v_01,this);
                detail::
                basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                ::
                create<std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&>
                          ((basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                            *)&parent_guard,this,
                           (span<const_std::byte,_18446744073709551615UL> *)local_330,
                           (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                           &node_critical_section.version,
                           (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                            *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4));
                optimistic_lock::write_guard::write_guard
                          (&node_guard,(read_critical_section *)local_280);
                bVar3 = optimistic_lock::write_guard::must_restart(&node_guard);
                if (bVar3) {
                  std::optional<bool>::optional
                            ((optional<bool> *)
                             ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                  node.tagged_ptr._4_4_ = 1;
                }
                else {
                  optimistic_lock::write_guard::write_guard
                            (&local_388,(read_critical_section *)auStack_310);
                  bVar3 = optimistic_lock::write_guard::must_restart(&local_388);
                  if (bVar3) {
                    std::optional<bool>::optional
                              ((optional<bool> *)
                               ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                  }
                  else {
                    poVar6 = std::
                             unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ::operator->((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                           *)&parent_guard);
                    local_398 = (EVP_PKEY_CTX *)local_330;
                    local_390 = existing_key._M_ptr;
                    local_3a8 = node_critical_section.version.version;
                    local_3a0 = remaining_key.field_0.key._M_ptr;
                    local_3ac = remaining_key.field_0.key._M_extent._M_extent_value._4_4_;
                    detail::
                    olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::init(poVar6,(EVP_PKEY_CTX *)local_330);
                    poVar6 = std::
                             unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ::release((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                        *)&parent_guard);
                    detail::basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                              (&local_3b8,(header_type *)poVar6,I4);
                    in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    ::operator=(piStack_2e8,local_3b8);
                  }
                  node.tagged_ptr._5_3_ = 0;
                  node.tagged_ptr._4_1_ = bVar3;
                  optimistic_lock::write_guard::~write_guard(&local_388);
                }
                optimistic_lock::write_guard::~write_guard(&node_guard);
                if (node.tagged_ptr._4_4_ == 0) {
                  account_growing_inode<(unodb::node_type)1>(this);
                  inode._7_1_ = 1;
                  std::optional<bool>::optional<bool,_true>
                            ((optional<bool> *)
                             ((long)&k_local.field_0.key._M_extent._M_extent_value + 6),
                             (bool *)((long)&inode + 7));
                  node.tagged_ptr._4_4_ = 1;
                }
                std::
                unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&parent_guard);
              }
            }
            else {
              if (type == LEAF) {
                __assert_fail("node_type != node_type::LEAF",
                              "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                              ,0x74c,
                              "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_insert(art_key_type, value_type, olc_db_leaf_unique_ptr_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                             );
              }
              key_prefix = (key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                            *)detail::basic_node_ptr<unodb::detail::olc_node_header>::
                              ptr<unodb::detail::olc_inode<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>*>
                                        (&local_290);
              _shared_prefix_length =
                   detail::
                   basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   ::get_key_prefix((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                     *)&key_prefix->f);
              local_3d1 = detail::
                          key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                          ::length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                    *)&_shared_prefix_length->f);
              shifted_key.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)
                   (__extent_storage<18446744073709551615UL>)remaining_key.field_0.key._M_ptr;
              shifted_key.field_0.key._M_ptr = (pointer)node_critical_section.version.version;
              local_3d8 = detail::
                          key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                          ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                               *)&_shared_prefix_length->f,shifted_key);
              if (local_3d8 < local_3d1) {
                k_00.field_0.key._M_extent._M_extent_value =
                     (__extent_storage<18446744073709551615UL>)
                     (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
                k_00.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
                v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
                v_00._M_ptr = (pointer)this_local;
                detail::
                create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                          ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>_conflict
                            *)parent_critical_section.version.version,k_00,v_00,this);
                detail::
                basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                ::
                create<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>&,unsigned_int_const&>
                          ((basic_inode<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>,2u,4u,(unodb::node_type)1,unodb::detail::fake_inode,unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                            *)&parent_guard_1,this,&local_290,&local_3d8);
                optimistic_lock::write_guard::write_guard
                          (&node_guard_1,(read_critical_section *)local_280);
                bVar3 = optimistic_lock::write_guard::must_restart(&node_guard_1);
                if (bVar3) {
                  std::optional<bool>::optional
                            ((optional<bool> *)
                             ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                  node.tagged_ptr._4_4_ = 1;
                }
                else {
                  optimistic_lock::write_guard::write_guard
                            (&local_428,(read_critical_section *)auStack_310);
                  bVar3 = optimistic_lock::write_guard::must_restart(&local_428);
                  if (bVar3) {
                    std::optional<bool>::optional
                              ((optional<bool> *)
                               ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                  }
                  else {
                    poVar6 = std::
                             unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ::operator->((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                           *)&parent_guard_1);
                    local_430 = (EVP_PKEY_CTX *)local_290.tagged_ptr;
                    local_434 = remaining_key.field_0.key._M_extent._M_extent_value._4_4_;
                    detail::
                    olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::init(poVar6,(EVP_PKEY_CTX *)local_290.tagged_ptr);
                    poVar6 = std::
                             unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ::release((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                        *)&parent_guard_1);
                    detail::basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
                              (&local_440,(header_type *)poVar6,I4);
                    in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    ::operator=(piStack_2e8,local_440);
                  }
                  node.tagged_ptr._5_3_ = 0;
                  node.tagged_ptr._4_1_ = bVar3;
                  optimistic_lock::write_guard::~write_guard(&local_428);
                }
                optimistic_lock::write_guard::~write_guard(&node_guard_1);
                if (node.tagged_ptr._4_4_ == 0) {
                  account_growing_inode<(unodb::node_type)1>(this);
                  LOCK();
                  (this->key_prefix_splits).super___atomic_base<unsigned_long>._M_i =
                       (this->key_prefix_splits).super___atomic_base<unsigned_long>._M_i + 1;
                  UNLOCK();
                  add_result.
                  super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                  ._15_1_ = 1;
                  std::optional<bool>::optional<bool,_true>
                            ((optional<bool> *)
                             ((long)&k_local.field_0.key._M_extent._M_extent_value + 6),
                             (bool *)&add_result.
                                      super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                                      ._M_payload.
                                      super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                                      .field_0xf);
                  node.tagged_ptr._4_4_ = 1;
                }
                std::
                unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                               *)&parent_guard_1);
              }
              else {
                if (local_3d8 != local_3d1) {
                  __assert_fail("shared_prefix_length == key_prefix_length",
                                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                ,0x76f,
                                "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_insert(art_key_type, value_type, olc_db_leaf_unique_ptr_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                               );
                }
                this_00 = (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                           *)((long)&remaining_key.field_0.key._M_extent._M_extent_value + 4);
                detail::
                tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                ::operator+=(this_00,(uint)local_3d1);
                detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                shift_right((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                            &node_critical_section.version,(ulong)local_3d1);
                this_02 = key_prefix;
                child_in_parent._7_1_ =
                     detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                     operator[]((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                 *)&node_critical_section.version,0);
                oVar9 = detail::
                        basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                        ::
                        add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                                  ((basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                                    *)&this_02->f,type,(byte *)((long)&child_in_parent + 7),
                                   (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                    *)&v_local._M_extent,
                                   (span<const_std::byte,_18446744073709551615UL> *)&this_local,this
                                   ,this_00,(read_critical_section *)auStack_310,
                                   &stack0xfffffffffffffd18,(read_critical_section *)local_280,
                                   (unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                    *)parent_critical_section.version.version);
                local_458 = oVar9.
                            super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                            ._M_payload;
                add_result.
                super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                ._M_payload._0_1_ =
                     oVar9.
                     super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                     ._M_engaged;
                bVar3 = std::optional::operator_cast_to_bool((optional *)&local_458);
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  ppiVar7 = std::
                            optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                            ::operator*((optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                                         *)&local_458);
                  auVar2 = local_280;
                  this_01 = *ppiVar7;
                  if (this_01 ==
                      (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                       *)0x0) {
                    child.tagged_ptr._7_1_ = 1;
                    std::optional<bool>::optional<bool,_true>
                              ((optional<bool> *)
                               ((long)&k_local.field_0.key._M_extent._M_extent_value + 6),
                               (bool *)((long)&child.tagged_ptr + 7));
                    node.tagged_ptr._4_4_ = 1;
                  }
                  else {
                    poVar1 = (optimistic_lock *)local_280;
                    paVar5 = (atomic<long> *)((long)local_280 + 8);
                    local_9c = 2;
                    ___b_2 = paVar5;
                    local_a0 = std::operator&(acquire,__memory_order_mask);
                    if (local_9c - 1U < 2) {
                      local_a8 = (paVar5->super___atomic_base<long>)._M_i;
                    }
                    else if (local_9c == 5) {
                      local_a8 = (paVar5->super___atomic_base<long>)._M_i;
                    }
                    else {
                      local_a8 = (paVar5->super___atomic_base<long>)._M_i;
                    }
                    if (local_a8 < 1) {
                      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const")
                      ;
                    }
                    local_84 = 2;
                    other = optimistic_lock::atomic_version_type::load_relaxed
                                      ((atomic_version_type *)auVar2);
                    bVar3 = optimistic_lock::version_type::operator==(&local_150,other);
                    if (((bVar3 ^ 0xffU) & 1) != 0) {
                      optimistic_lock::dec_read_lock_count((optimistic_lock *)auVar2);
                    }
                    if (bVar3) {
                      local_10 = (atomic<long> *)((long)auVar2 + 8);
                      local_18 = 1;
                      local_1c = 3;
                      local_28 = 1;
                      LOCK();
                      local_108 = (local_10->super___atomic_base<long>)._M_i;
                      (local_10->super___atomic_base<long>)._M_i =
                           (local_10->super___atomic_base<long>)._M_i + -1;
                      UNLOCK();
                      old_value_2 = (__int_type_conflict)poVar1;
                      local_30 = local_108;
                      if (local_108 < 1) {
                        __assert_fail("old_value > 0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                                      ,0x343,
                                      "void unodb::optimistic_lock::dec_read_lock_count() const");
                      }
                    }
                    local_280 = (undefined1  [8])0x0;
                    if (((bVar3 ^ 0xffU) & 1) == 0) {
                      bVar8 = in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                              ::load(this_01);
                      optimistic_lock::read_critical_section::operator=
                                ((read_critical_section *)local_280,
                                 (read_critical_section *)auStack_310);
                      piStack_2e8 = this_01;
                      local_290 = bVar8;
                      detail::
                      tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                      ::operator++((tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                                    *)((long)&remaining_key.field_0.key._M_extent._M_extent_value +
                                      4));
                      detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::
                      shift_right((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                   *)&node_critical_section.version,1);
                      bVar3 = optimistic_lock::read_critical_section::check
                                        ((read_critical_section *)local_280);
                      if (((bVar3 ^ 0xffU) & 1) == 0) {
                        node.tagged_ptr._4_4_ = 0;
                      }
                      else {
                        std::optional<bool>::optional
                                  ((optional<bool> *)
                                   ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                        node.tagged_ptr._4_4_ = 1;
                      }
                    }
                    else {
                      std::optional<bool>::optional
                                ((optional<bool> *)
                                 ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                      node.tagged_ptr._4_4_ = 1;
                    }
                  }
                }
                else {
                  std::optional<bool>::optional
                            ((optional<bool> *)
                             ((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
                  node.tagged_ptr._4_4_ = 1;
                }
              }
            }
          }
          optimistic_lock::read_critical_section::~read_critical_section
                    ((read_critical_section *)auStack_310);
        } while (node.tagged_ptr._4_4_ == 0);
      }
      else {
        spin_wait_loop_body();
        std::optional<bool>::optional
                  ((optional<bool> *)((long)&k_local.field_0.key._M_extent._M_extent_value + 6));
        node.tagged_ptr._4_4_ = 1;
      }
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_280)
  ;
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)k_local.field_0.key._M_extent._M_extent_value._6_2_;
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_insert(art_key_type k, value_type v,
                               olc_db_leaf_unique_ptr_type& cached_leaf) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    create_leaf_if_needed(cached_leaf, k, v, *this);

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) {
      // Do not call spin_wait_loop_body here - creating the leaf took some time
      return {};  // LCOV_EXCL_LINE
    }

    root = detail::olc_node_ptr{cached_leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  while (true) {
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      if (UNODB_DETAIL_UNLIKELY(k.cmp(existing_key) == 0)) {
        if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE

        if (UNODB_DETAIL_UNLIKELY(cached_leaf != nullptr)) {
          cached_leaf.reset();  // LCOV_EXCL_LINE
        }
        return false;  // exists
      }

      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(existing_key, remaining_key, depth, leaf,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, node, shared_prefix_length)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(node, shared_prefix_length, depth,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }

#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      key_prefix_splits.fetch_add(1, std::memory_order_relaxed);
#endif  // UNODB_DETAIL_WITH_STATS

      return true;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);

    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto add_result{inode->template add_or_choose_subtree<
        std::optional<in_critical_section<detail::olc_node_ptr>*>>(
        node_type, remaining_key[0], k, v, *this, depth, node_critical_section,
        node_in_parent, parent_critical_section, cached_leaf)};

    if (UNODB_DETAIL_UNLIKELY(!add_result)) return {};

    auto* const child_in_parent = *add_result;
    if (child_in_parent == nullptr) return true;

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    ++depth;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}